

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamSummary.h
# Opt level: O0

void __thiscall StreamSummary<4U>::~StreamSummary(StreamSummary<4U> *this)

{
  unordered_map<Data<4U>,_StreamSummary<4U>::StreamCounter_*,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>_>
  *puVar1;
  void *pvVar2;
  long in_RDI;
  StreamCounter *next_counter;
  StreamCounter *temp_counter;
  StreamBucket *next_bucket;
  StreamBucket *temp_bucket;
  key_type *in_stack_ffffffffffffffb8;
  unordered_map<Data<4U>,_StreamSummary<4U>::StreamCounter_*,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>_>
  *in_stack_ffffffffffffffc0;
  void *local_20;
  unordered_map<Data<4U>,_StreamSummary<4U>::StreamCounter_*,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>_>
  *local_10;
  
  puVar1 = *(unordered_map<Data<4U>,_StreamSummary<4U>::StreamCounter_*,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>_>
             **)(in_RDI + 0x40);
  while (local_10 = puVar1,
        local_10 !=
        (unordered_map<Data<4U>,_StreamSummary<4U>::StreamCounter_*,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>_>
         *)0x0) {
    puVar1 = (unordered_map<Data<4U>,_StreamSummary<4U>::StreamCounter_*,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>_>
              *)(local_10->_M_h)._M_before_begin._M_nxt;
    pvVar2 = (void *)(local_10->_M_h)._M_element_count;
    while (local_20 = pvVar2, local_20 != (void *)0x0) {
      pvVar2 = *(void **)((long)local_20 + 0x10);
      std::
      unordered_map<Data<4U>,_StreamSummary<4U>::StreamCounter_*,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>_>
      ::erase(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      if (local_20 != (void *)0x0) {
        operator_delete(local_20,0x20);
      }
    }
    in_stack_ffffffffffffffc0 = local_10;
    if (local_10 !=
        (unordered_map<Data<4U>,_StreamSummary<4U>::StreamCounter_*,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>_>
         *)0x0) {
      operator_delete(local_10,0x20);
      in_stack_ffffffffffffffc0 = local_10;
    }
  }
  std::
  unordered_map<Data<4U>,_StreamSummary<4U>::StreamCounter_*,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>_>
  ::~unordered_map((unordered_map<Data<4U>,_StreamSummary<4U>::StreamCounter_*,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>_>
                    *)0x116c46);
  return;
}

Assistant:

~StreamSummary() {
		StreamBucket* temp_bucket = min_bucket, * next_bucket;

		while (temp_bucket != NULL) {
			next_bucket = (StreamBucket*)temp_bucket->next;

			StreamCounter* temp_counter = temp_bucket->child, * next_counter;
			while (temp_counter != NULL) {
				next_counter = (StreamCounter*)temp_counter->next;
				mp.erase(temp_counter->ID);
				delete temp_counter;
				temp_counter = next_counter;
			}

			delete temp_bucket;
			temp_bucket = next_bucket;
		}
	}